

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupAppend(Gia_Man_t *pNew,Gia_Man_t *pTwo)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTwo_local;
  Gia_Man_t *pNew_local;
  
  if (0 < pNew->nRegs) {
    pNew->nRegs = 0;
  }
  iVar1 = Vec_IntSize(&pNew->vHTable);
  if (iVar1 == 0) {
    Gia_ManHashStart(pNew);
  }
  pGVar3 = Gia_ManConst0(pTwo);
  pGVar3->Value = 0;
  local_24 = 1;
  while( true ) {
    bVar4 = false;
    if (local_24 < pTwo->nObjs) {
      pGStack_20 = Gia_ManObj(pTwo,local_24);
      bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_20);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_20);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjFanin0Copy(pGStack_20);
          uVar2 = Gia_ManAppendCo(pNew,iVar1);
          pGStack_20->Value = uVar2;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(pNew);
        pGStack_20->Value = uVar2;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      iLit1 = Gia_ObjFanin1Copy(pGStack_20);
      uVar2 = Gia_ManAppendAnd(pNew,iVar1,iLit1);
      pGStack_20->Value = uVar2;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Gia_ManDupAppend( Gia_Man_t * pNew, Gia_Man_t * pTwo )
{
    Gia_Obj_t * pObj;
    int i;
    if ( pNew->nRegs > 0 )
        pNew->nRegs = 0;
    if ( Vec_IntSize(&pNew->vHTable) == 0 )
        Gia_ManHashStart( pNew );
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
}